

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O0

void __thiscall
NewEdgeCalculator::calculateProbM(NewEdgeCalculator *this,mapValue *val1,mapValue *val2,double *res)

{
  double dVar1;
  double sum;
  double *res_local;
  mapValue *val2_local;
  mapValue *val1_local;
  NewEdgeCalculator *this_local;
  
  if (val1->base == val2->base) {
    dVar1 = (1.0 - val1->prob) * (1.0 - val2->prob) + val1->prob * (val2->prob / 3.0);
  }
  else {
    dVar1 = (val1->prob / 3.0) * 2.0 * (val2->prob / 3.0) +
            (1.0 - val1->prob) * (val2->prob / 3.0) + (1.0 - val2->prob) * (val1->prob / 3.0);
  }
  sum = dVar1 + 0.0;
  *res = sum * *res;
  return;
}

Assistant:

void NewEdgeCalculator::calculateProbM(const AlignmentRecord::mapValue & val1,const AlignmentRecord::mapValue & val2, double& res) const{
    double sum = 0.0;
    if(val1.base==val2.base){
        sum+=(1.0-val1.prob)*(1.0-val2.prob)+(val1.prob)*(val2.prob/3);
    } else  {
        sum+=(1.0-val1.prob)*(val2.prob/3)+(1.0-val2.prob)*(val1.prob/3)+2*(val1.prob/3)*(val2.prob/3);
    }
    res*=sum;
}